

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O1

int __thiscall HevcSpsUnit::sub_layer_hrd_parameters(HevcSpsUnit *this,uint cpb_cnt_minus1)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar1 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
  if (uVar1 == 0xffffffff) {
    uVar1 = 1;
  }
  else {
    bVar3 = true;
    uVar1 = 0;
    do {
      uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
      if (uVar2 == 0xffffffff) break;
      if (this->sub_pic_hrd_params_present_flag == true) {
        uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
        if (uVar2 == 0xffffffff) break;
        uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
        if (uVar2 == 0xffffffff) break;
      }
      BitStreamReader::skipBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
      uVar1 = uVar1 + 1;
      bVar3 = uVar1 <= cpb_cnt_minus1;
      if (cpb_cnt_minus1 < uVar1) break;
      uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    } while (uVar2 != 0xffffffff);
    uVar1 = (uint)bVar3;
  }
  return uVar1;
}

Assistant:

int HevcSpsUnit::sub_layer_hrd_parameters(const unsigned cpb_cnt_minus1)
{
    for (unsigned i = 0; i <= cpb_cnt_minus1; i++)
    {
        if (extractUEGolombCode() == UINT32_MAX)  // bit_rate_value_minus1[i]
            return 1;
        if (extractUEGolombCode() == UINT32_MAX)  // cpb_size_value_minus1[i]
            return 1;
        if (sub_pic_hrd_params_present_flag)
        {
            if (extractUEGolombCode() == UINT32_MAX)  // cpb_size_du_value_minus1[i]
                return 1;
            if (extractUEGolombCode() == UINT32_MAX)  // bit_rate_du_value_minus1[i]
                return 1;
        }
        m_reader.skipBit();  // cbr_flag[i]
    }
    return 0;
}